

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int ac,char **av)

{
  char *__s;
  bool bVar1;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f8 [8];
  Core c;
  char **av_local;
  int ac_local;
  
  if (ac == 2) {
    c._p._120_8_ = av;
    Core::Core((Core *)local_f8);
    __s = *(char **)(c._p._120_8_ + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,__s,&local_119);
    bVar1 = Core::run((Core *)local_f8,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      av_local._4_4_ = 0;
    }
    else {
      av_local._4_4_ = 0x54;
    }
    Core::~Core((Core *)local_f8);
  }
  else {
    av_local._4_4_ = 0x54;
  }
  return av_local._4_4_;
}

Assistant:

int main(int ac, char **av)
{
    if (ac != 2)
        return 84;

    Core c;

    if (!c.run(av[1]))
        return 84;

    return 0;
}